

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::EntryAt(RecyclableObject *function,CallInfo callInfo,...)

{
  uint uVar1;
  ScriptContext *pSVar2;
  ThreadContext *pTVar3;
  code *pcVar4;
  double T1;
  Type this;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  Var aValue;
  INT64 IVar9;
  RecyclableObject *pRVar10;
  ulong uVar11;
  int in_stack_00000010;
  CallInfo local_70;
  CallInfo callInfo_local;
  ArgumentReader args;
  JavascriptString *pThis;
  Var value;
  JsReentLock jsReentLock;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_70 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x2c4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00bbbc06;
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_70,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pTVar3 = pSVar2->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  bVar5 = pTVar3->noJsReentrancy;
  pTVar3->noJsReentrancy = true;
  value = pTVar3;
  jsReentLock.m_arrayObject2._0_1_ = bVar5;
  if (((ulong)local_70 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x2c8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) {
LAB_00bbbc06:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  args.super_Arguments.Values = (Type)0x0;
  pTVar3->noJsReentrancy = bVar5;
  GetThisStringArgument
            ((ArgumentReader *)&callInfo_local,pSVar2,L"String.prototype.at",
             (JavascriptString **)&args.super_Arguments.Values);
  JsReentLock::MutateArrayObject((JsReentLock *)&value);
  this = args.super_Arguments.Values;
  *(undefined1 *)((long)value + 0x108) = 1;
  uVar1 = *(uint *)(args.super_Arguments.Values + 3);
  if ((callInfo_local._0_4_ & 0xfffffe) == 0) {
    uVar11 = 0;
  }
  else {
    *(undefined1 *)((long)value + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    aValue = Arguments::operator[]((Arguments *)&callInfo_local,1);
    T1 = JavascriptConversion::ToInteger(aValue,pSVar2);
    IVar9 = NumberUtilities::TryToInt64(T1);
    JsReentLock::MutateArrayObject((JsReentLock *)&value);
    *(undefined1 *)((long)value + 0x108) = 1;
    uVar11 = (ulong)((uint)(IVar9 >> 0x3f) & uVar1) + IVar9;
  }
  if (uVar11 < uVar1) {
    BVar7 = GetItemAt((JavascriptString *)this,(charcount_t)uVar11,&pThis);
    if (BVar7 == 0) {
      pRVar10 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
                .undefinedValue.ptr;
    }
    else {
      pRVar10 = (RecyclableObject *)BreakSpeculation(pThis);
    }
  }
  else {
    pRVar10 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
  }
  *(undefined1 *)((long)value + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pRVar10;
}

Assistant:

Var JavascriptString::EntryAt(RecyclableObject* function, CallInfo callInfo, ...) {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString * pThis = nullptr;

        // 1. Let O be ? RequireObjectCoercible(this value).
        // 2. Let S be ? ToString(O).
        JS_REENTRANT(jsReentLock, GetThisStringArgument(args, scriptContext, _u("String.prototype.at"), &pThis));

        // 3. Let len be the length of S.
        charcount_t len = pThis->GetLength();

        // 4. Let relativeIndex be ? ToInteger(index).
        int64_t relativeIndex = 0;

        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, relativeIndex = NumberUtilities::TryToInt64(JavascriptConversion::ToInteger(args[1], scriptContext)));
        }

        // 5. If relativeIndex >= 0, then
        //     a. Let k be relativeIndex.
        // 6. Else,
        //     a. Let k be len + relativeIndex.
        int64_t k = relativeIndex;
        
        if (relativeIndex < 0)
        {
            k += len;
        }
        
        // 7. If k < 0 or k >= len, then return undefined.
        if (k < 0 || k >= (int64_t)len)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        
        Var value;
        // 8. Return the String value consisting of only the code unit at position k in S.
        if (pThis->GetItemAt((charcount_t)k, &value))
        {
#ifdef ENABLE_SPECTRE_RUNTIME_MITIGATIONS
            value = BreakSpeculation(value);
#endif
            return value;
        }
        else
        {
            // Yes, i except this to be
            return scriptContext->GetLibrary()->GetUndefined();
        }
    }